

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Velocitizer.cpp
# Opt level: O1

void __thiscall OpenMD::Velocitizer::removeComDrift(Velocitizer *this)

{
  double *pdVar1;
  int iVar2;
  Molecule *pMVar3;
  pointer ppSVar4;
  StuntDouble *pSVar5;
  uint i;
  long lVar6;
  MoleculeIterator mi;
  Vector<double,_3U> result;
  Vector3d vdrift;
  MoleculeIterator local_70;
  double local_68 [4];
  double local_48 [4];
  Vector3d local_28;
  
  Thermo::getComVel(&local_28,&this->thermo_);
  local_70._M_node = (_Base_ptr)0x0;
  pMVar3 = SimInfo::beginMolecule(this->info_,&local_70);
  if (pMVar3 != (Molecule *)0x0) {
    do {
      ppSVar4 = (pMVar3->integrableObjects_).
                super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      while( true ) {
        if (ppSVar4 ==
            (pMVar3->integrableObjects_).
            super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          pSVar5 = (StuntDouble *)0x0;
        }
        else {
          pSVar5 = *ppSVar4;
        }
        if (pSVar5 == (StuntDouble *)0x0) break;
        lVar6 = *(long *)((long)&(pSVar5->snapshotMan_->currentSnapshot_->atomData).velocity.
                                 super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + pSVar5->storage_);
        local_48[2] = (double)*(undefined8 *)(lVar6 + 0x10 + (long)pSVar5->localIndex_ * 0x18);
        pdVar1 = (double *)(lVar6 + (long)pSVar5->localIndex_ * 0x18);
        local_48[0] = *pdVar1;
        local_48[1] = pdVar1[1];
        local_68[0] = 0.0;
        local_68[1] = 0.0;
        local_68[2] = 0.0;
        lVar6 = 0;
        do {
          local_68[lVar6] = local_48[lVar6] - local_28.super_Vector<double,_3U>.data_[lVar6];
          lVar6 = lVar6 + 1;
        } while (lVar6 != 3);
        iVar2 = pSVar5->localIndex_;
        lVar6 = *(long *)((long)&(pSVar5->snapshotMan_->currentSnapshot_->atomData).velocity.
                                 super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + pSVar5->storage_);
        *(double *)(lVar6 + 0x10 + (long)iVar2 * 0x18) = local_68[2];
        pdVar1 = (double *)(lVar6 + (long)iVar2 * 0x18);
        *pdVar1 = local_68[0];
        pdVar1[1] = local_68[1];
        ppSVar4 = ppSVar4 + 1;
      }
      pMVar3 = SimInfo::nextMolecule(this->info_,&local_70);
    } while (pMVar3 != (Molecule *)0x0);
  }
  return;
}

Assistant:

void Velocitizer::removeComDrift() {
    // Get the Center of Mass drift velocity.
    Vector3d vdrift = thermo_.getComVel();

    SimInfo::MoleculeIterator mi;
    Molecule::IntegrableObjectIterator ioi;
    Molecule* mol;
    StuntDouble* sd;

    //  Corrects for the center of mass drift.
    // sums all the momentum and divides by total mass.
    for (mol = info_->beginMolecule(mi); mol != NULL;
         mol = info_->nextMolecule(mi)) {
      for (sd = mol->beginIntegrableObject(ioi); sd != NULL;
           sd = mol->nextIntegrableObject(ioi)) {
        sd->setVel(sd->getVel() - vdrift);
      }
    }
  }